

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-detection.c
# Opt level: O3

int coda_evaluate_detection_node
              (coda_detection_node *node,coda_cursor *cursor,coda_product_definition **definition)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  int result;
  coda_cursor subcursor;
  int local_334;
  coda_cursor local_330;
  
  memcpy(&local_330,cursor,0x310);
  *definition = (coda_product_definition *)0x0;
  if (node == (coda_detection_node *)0x0) {
    return 0;
  }
  if (node->path == (char *)0x0) {
    if (node->expression != (coda_expression *)0x0) {
      iVar1 = coda_expression_eval_bool(node->expression,&local_330,&local_334);
      if (iVar1 != 0) goto LAB_0010cfed;
      if (local_334 == 0) {
        return 0;
      }
    }
  }
  else {
    iVar1 = coda_cursor_goto(&local_330,node->path);
    if (iVar1 != 0) {
LAB_0010cfed:
      *(undefined4 *)(in_FS_OFFSET + -0x11e0) = 0;
      return 0;
    }
  }
  if (0 < node->num_subnodes) {
    lVar2 = 0;
    do {
      coda_evaluate_detection_node(node->subnode[lVar2],&local_330,definition);
      if (*definition != (coda_product_definition *)0x0) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < node->num_subnodes);
  }
  if (node->rule != (coda_detection_rule *)0x0) {
    *definition = node->rule->product_definition;
  }
  return 0;
}

Assistant:

int coda_evaluate_detection_node(coda_detection_node *node, coda_cursor *cursor, coda_product_definition **definition)
{
    coda_cursor subcursor = *cursor;
    int i;

    *definition = NULL;
    if (node == NULL)
    {
        return 0;
    }
    if (node->path != NULL)
    {
        if (coda_cursor_goto(&subcursor, node->path) != 0)
        {
            /* treat failures as 'does not exist' */
            coda_errno = 0;
            return 0;
        }
    }
    else if (node->expression != NULL)
    {
        int result;

        if (coda_expression_eval_bool(node->expression, &subcursor, &result) != 0)
        {
            /* treat failures as 'mismatches' */
            coda_errno = 0;
            return 0;
        }
        if (result == 0)
        {
            return 0;
        }
    }

    for (i = 0; i < node->num_subnodes; i++)
    {
        if (coda_evaluate_detection_node(node->subnode[i], &subcursor, definition) != 0)
        {
            return -1;
        }
        if (*definition != NULL)
        {
            return 0;
        }
    }

    if (node->rule != NULL)
    {
        *definition = node->rule->product_definition;
    }

    return 0;
}